

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O1

cmValue __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  cmStateSnapshot *this_00;
  size_t __n;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  PointerType pBVar4;
  cmValue cVar5;
  string *__x;
  cmStateSnapshot *ci;
  pointer this_01;
  cmState *pcVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rng;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string_view separator;
  string_view separator_00;
  string_view separator_01;
  string_view separator_02;
  string_view separator_03;
  string_view separator_04;
  cmStateSnapshot parent;
  cmStateSnapshot snp;
  cmStateSnapshot local_88;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_40;
  cmState *local_38;
  
  if (GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') {
    GetProperty();
  }
  GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length = 0;
  *GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p = '\0';
  iVar3 = std::__cxx11::string::compare((char *)prop);
  if (iVar3 == 0) {
    cmStateSnapshot::GetBuildsystemDirectoryParent(&local_88,&this->Snapshot_);
    bVar2 = cmStateSnapshot::IsValid(&local_88);
    if (bVar2) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&local_88);
      pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)local_70);
      return (cmValue)&pBVar4->Location;
    }
    return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
  }
  __n = prop->_M_string_length;
  if ((__n == kBINARY_DIR_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,kBINARY_DIR_abi_cxx11_._M_dataplus._M_p,__n),
      iVar3 == 0)))) {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
LAB_001e9d22:
    std::__cxx11::string::_M_assign
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
  }
  if ((__n == kSOURCE_DIR_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,kSOURCE_DIR_abi_cxx11_._M_dataplus._M_p,__n),
      iVar3 == 0)))) {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
    goto LAB_001e9d22;
  }
  if ((__n == kSUBDIRECTORIES_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,kSUBDIRECTORIES_abi_cxx11_._M_dataplus._M_p,__n),
      iVar3 == 0)))) {
    local_88._0_16_ = ZEXT816(0);
    local_88.Position.Position = 0;
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88,
              ((long)(pBVar4->Children).
                     super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pBVar4->Children).
                     super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    this_01 = (pBVar4->Children).
              super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar1 = (pBVar4->Children).
             super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_01 != pcVar1) {
      do {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,this_01);
        pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           ((iterator *)local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88,&pBVar4->Location);
        this_01 = this_01 + 1;
      } while (this_01 != pcVar1);
    }
    separator._M_str = ";";
    separator._M_len = 1;
    cmJoin((string *)local_70,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88,separator,(string_view)ZEXT816(0));
    goto LAB_001e9f8c;
  }
  if ((__n == kBUILDSYSTEM_TARGETS_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,kBUILDSYSTEM_TARGETS_abi_cxx11_._M_dataplus._M_p,__n),
      iVar3 == 0)))) {
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    rng = &pBVar4->NormalTargetNames;
  }
  else {
    if ((__n != 0x10) ||
       (iVar3 = bcmp((prop->_M_dataplus)._M_p,"IMPORTED_TARGETS",0x10), iVar3 != 0)) {
      iVar3 = std::__cxx11::string::compare((char *)prop);
      if (iVar3 == 0) {
        local_88._0_16_ = ZEXT816(0);
        local_88.Position.Position = 0;
        local_38 = (cmState *)(this->Snapshot_).Position.Position;
        this_00 = (cmStateSnapshot *)(local_60 + 0x18);
        local_60._24_8_ = (this->Snapshot_).State;
        pcStack_40 = (this->Snapshot_).Position.Tree;
        while (bVar2 = cmStateSnapshot::IsValid(this_00), bVar2) {
          __x = cmStateSnapshot::GetExecutionListFile_abi_cxx11_(this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_88,__x);
          cmStateSnapshot::GetCallStackParent((cmStateSnapshot *)local_70,this_00);
          local_38 = (cmState *)local_60._0_8_;
          local_60._24_8_ = local_70._0_8_;
          pcStack_40 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_70._8_8_;
        }
        paVar7 = &(((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_88.Position.Tree + -1))->Value).field_2;
        pcVar6 = local_88.State;
        if (local_88.State < paVar7 && local_88.State != (cmState *)local_88.Position.Tree) {
          do {
            std::__cxx11::string::swap((string *)pcVar6);
            pcVar6 = (cmState *)
                     &((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)pcVar6)->Backtrace;
            paVar7 = paVar7 + -2;
          } while (pcVar6 < paVar7);
        }
        separator_00._M_str = ";";
        separator_00._M_len = 1;
        cmJoin((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88,separator_00,(string_view)ZEXT816(0));
LAB_001e9f8c:
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (string *)local_70);
        if ((cmState *)local_70._0_8_ != (cmState *)local_60) {
          operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
        return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
      }
      iVar3 = std::__cxx11::string::compare((char *)prop);
      if (iVar3 == 0) {
        cmState::GetCacheEntryKeys_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88,(this->Snapshot_).State);
        separator_01._M_str = ";";
        separator_01._M_len = 1;
        cmJoin((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88,separator_01,(string_view)ZEXT816(0));
        goto LAB_001e9f8c;
      }
      iVar3 = std::__cxx11::string::compare((char *)prop);
      if (iVar3 == 0) {
        cmStateSnapshot::ClosureKeys_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88,&this->Snapshot_);
        cmState::GetCacheEntryKeys_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,(this->Snapshot_).State);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                   local_88.Position.Tree,local_70._0_8_,local_70._8_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_70);
        std::
        sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )local_88.State,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )local_88.Position.Tree);
        separator_03._M_str = ";";
        separator_03._M_len = 1;
        cmJoin((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88,separator_03,(string_view)ZEXT816(0));
        goto LAB_001e9f8c;
      }
      iVar3 = std::__cxx11::string::compare((char *)prop);
      if (iVar3 == 0) {
        local_88._0_16_ = GetIncludeDirectoriesEntries_abi_cxx11_(this);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)prop);
        if (iVar3 == 0) {
          local_88._0_16_ = GetCompileOptionsEntries_abi_cxx11_(this);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)prop);
          if (iVar3 == 0) {
            local_88._0_16_ = GetCompileDefinitionsEntries_abi_cxx11_(this);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)prop);
            if (iVar3 == 0) {
              local_88._0_16_ = GetLinkOptionsEntries_abi_cxx11_(this);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)prop);
              if (iVar3 != 0) {
                pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                         operator->(&this->DirectoryState);
                cVar5 = cmPropertyMap::GetPropertyValue(&pBVar4->Properties,prop);
                if (!chain || cVar5.Value != (string *)0x0) {
                  return (cmValue)cVar5.Value;
                }
                cmStateSnapshot::GetBuildsystemDirectoryParent(&local_88,&this->Snapshot_);
                bVar2 = cmStateSnapshot::IsValid(&local_88);
                if (bVar2) {
                  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&local_88);
                  cVar5 = GetProperty((cmStateDirectory *)local_70,prop,true);
                  return (cmValue)cVar5.Value;
                }
                cVar5 = cmState::GetGlobalProperty((this->Snapshot_).State,prop);
                return (cmValue)cVar5.Value;
              }
              local_88._0_16_ = GetLinkDirectoriesEntries_abi_cxx11_(this);
            }
          }
        }
      }
      separator_04._M_str = ";";
      separator_04._M_len = 1;
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                ((string *)local_70,
                 (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)&local_88,separator_04);
      goto LAB_001ea01a;
    }
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    rng = &pBVar4->ImportedTargetNames;
  }
  separator_02._M_str = ";";
  separator_02._M_len = 1;
  cmJoin((string *)local_70,rng,separator_02,(string_view)ZEXT816(0));
LAB_001ea01a:
  std::__cxx11::string::operator=
            ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
             (string *)local_70);
  if ((cmState *)local_70._0_8_ == (cmState *)local_60) {
    return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
  }
  operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
  return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
}

Assistant:

cmValue cmStateDirectory::GetProperty(const std::string& prop,
                                      bool chain) const
{
  static std::string output;
  output.clear();
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return cmValue(parent.GetDirectory().GetCurrentSource());
    }
    return cmValue(output);
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return cmValue(output);
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return cmValue(output);
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    child_dirs.reserve(children.size());
    for (cmStateSnapshot const& ci : children) {
      child_dirs.push_back(ci.GetDirectory().GetCurrentSource());
    }
    output = cmJoin(child_dirs, ";");
    return cmValue(output);
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmJoin(this->DirectoryState->NormalTargetNames, ";");
    return cmValue(output);
  }
  if (prop == "IMPORTED_TARGETS"_s) {
    output = cmJoin(this->DirectoryState->ImportedTargetNames, ";");
    return cmValue(output);
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return cmValue(output);
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return cmValue(output);
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    cm::append(res, this->Snapshot_.State->GetCacheEntryKeys());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return cmValue(output);
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return cmValue(output);
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return cmValue(output);
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return cmValue(output);
  }
  if (prop == "LINK_OPTIONS") {
    output = cmJoin(this->GetLinkOptionsEntries(), ";");
    return cmValue(output);
  }
  if (prop == "LINK_DIRECTORIES") {
    output = cmJoin(this->GetLinkDirectoriesEntries(), ";");
    return cmValue(output);
  }

  cmValue retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}